

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

bool __thiscall
args::ArgumentParser::
Complete<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (ArgumentParser *this,FlagBase *flag,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          it,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             end)

{
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *choice;
  _Alloc_hider choice_00;
  string local_48;
  
  if ((this->readCompletion & it._M_current + 1 == end._M_current) != 0) {
    if ((flag->super_NamedBase).choicesStringManual == true) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_48,&(flag->super_NamedBase).choicesStrings);
      choice_00._M_p = local_48._M_dataplus._M_p;
    }
    else {
      (*(flag->super_NamedBase).super_Base._vptr_Base[0x10])(&local_48,flag,&this->helpParams);
      choice_00._M_p = local_48._M_dataplus._M_p;
    }
    for (; choice_00._M_p != (pointer)local_48._M_string_length;
        choice_00._M_p = (pointer)((long)choice_00._M_p + 0x20)) {
      AddCompletionReply(this,it._M_current,(string *)choice_00._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    CompletionFlag::Get_abi_cxx11_(&local_48,this->completion);
    std::runtime_error::runtime_error(this_00,(string *)&local_48);
    *(undefined ***)this_00 = &PTR__runtime_error_0011d718;
    __cxa_throw(this_00,&Completion::typeinfo,std::runtime_error::~runtime_error);
  }
  return false;
}

Assistant:

bool Complete(FlagBase &flag, It it, It end)
            {
                auto nextIt = it;
                if (!readCompletion || (++nextIt != end))
                {
                    return false;
                }

                const auto &chunk = *it;
                for (auto &choice : flag.HelpChoices(helpParams))
                {
                    AddCompletionReply(chunk, choice);
                }

#ifndef ARGS_NOEXCEPT
                throw Completion(completion->Get());
#else
                return true;
#endif
            }